

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SupplyAppearance.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::SupplyAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SupplyAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KINT32 Value_02;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Supply Appearance:");
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Paint Scheme:         ");
  ENUMS::GetEnumAsStringEntityPaintScheme_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)((uint)*this & 1),Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Damage:               ");
  ENUMS::GetEnumAsStringEntityDamage_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)((uint)*this >> 3 & 3),Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Parachute Status:     ");
  ENUMS::GetEnumAsStringParachute_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)((uint)*this >> 7 & 3),Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Flaming Effect:       ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Frozen Status:        ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"State:                ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Deployed Status:      ");
  ENUMS::GetEnumAsStringSupplyDeployed_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)((byte)this->field_0x3 & 3),Value_02);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"\n\t");
  poVar1 = std::operator<<(poVar1,"Masked/Cloaked:       ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"\n\t");
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString SupplyAppearance::GetAsString() const
{
    KStringStream ss;

    ss <<            "Supply Appearance:"
       << sRetTab << "Paint Scheme:         " << GetEnumAsStringEntityPaintScheme( m_PaintScheme )
       << sRetTab << "Damage:               " << GetEnumAsStringEntityDamage( m_Damage )
       << sRetTab << "Parachute Status:     " << GetEnumAsStringParachute( m_ParachuteStatus )
       << sRetTab << "Flaming Effect:       " << m_FlamingEffectField
       << sRetTab << "Frozen Status:        " << m_FrozenStatus
       << sRetTab << "State:                " << m_State
       << sRetTab << "Deployed Status:      " << GetEnumAsStringSupplyDeployed( m_DeployedStatus )
       << sRetTab << "Masked/Cloaked:       " << m_MaskedCloaked
       << sRetTab;

    return ss.str();
}